

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase
          (iterator *__return_storage_ptr__,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,iterator pos)

{
  NodeBase *pNVar1;
  bool bVar2;
  iterator *piVar3;
  iterator *extraout_RAX;
  iterator *piVar4;
  undefined8 uVar5;
  NodeBase *item;
  undefined8 uVar6;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *pMVar7;
  char *pcVar8;
  iterator tree_it;
  uint uStack_74;
  TreeIterator TStack_70;
  LogMessageFatal aLStack_60 [16];
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *pMStack_50;
  iterator *piStack_48;
  UntypedMapIterator local_38;
  
  local_38.node_ = pos.super_UntypedMapIterator.node_;
  local_38.m_ = pos.super_UntypedMapIterator.m_;
  local_38._16_8_ = pos.super_UntypedMapIterator._16_8_;
  pNVar1 = (pos.super_UntypedMapIterator.node_)->next;
  if ((pos.super_UntypedMapIterator.node_)->next == (NodeBase *)0x0) {
    internal::UntypedMapIterator::SearchFrom
              (&local_38,pos.super_UntypedMapIterator.bucket_index_ + 1);
    pNVar1 = local_38.node_;
  }
  local_38.node_ = pNVar1;
  (__return_storage_ptr__->super_UntypedMapIterator).bucket_index_ = local_38.bucket_index_;
  *(undefined4 *)&(__return_storage_ptr__->super_UntypedMapIterator).field_0x14 = local_38._20_4_;
  (__return_storage_ptr__->super_UntypedMapIterator).node_ = local_38.node_;
  (__return_storage_ptr__->super_UntypedMapIterator).m_ = local_38.m_;
  if (pos.super_UntypedMapIterator.m_ == (UntypedMapBase *)this) {
    internal::KeyMapBase<google::protobuf::MapKey>::erase_no_destroy
              (&this->super_KeyMapBase<google::protobuf::MapKey>,
               pos.super_UntypedMapIterator.bucket_index_,
               (KeyNode *)pos.super_UntypedMapIterator.node_);
    DestroyNode(this,(Node *)pos.super_UntypedMapIterator.node_);
    return __return_storage_ptr__;
  }
  pMVar7 = this;
  Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::erase();
  uStack_74 = (uint)pMVar7;
  TStack_70.node_ =
       (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
        *)0x0;
  TStack_70.position_ = -1;
  pMStack_50 = this;
  piStack_48 = __return_storage_ptr__;
  bVar2 = internal::KeyMapBase<google::protobuf::MapKey>::revalidate_if_necessary
                    ((KeyMapBase<google::protobuf::MapKey> *)pos.super_UntypedMapIterator.m_,
                     &uStack_74,(KeyNode *)item,&TStack_70);
  if (bVar2) {
    pNVar1 = (NodeBase *)(pos.super_UntypedMapIterator.m_)->table_[uStack_74];
    if ((pNVar1 == (NodeBase *)0x0) || (((ulong)pNVar1 & 1) != 0)) {
      pcVar8 = "TableEntryIsNonEmptyList(b)";
      uVar5 = 0x1b;
      uVar6 = 0x3bc;
    }
    else {
      piVar3 = (iterator *)internal::EraseFromLinkedList(item,pNVar1);
      if (((ulong)piVar3 & 1) == 0) {
        (pos.super_UntypedMapIterator.m_)->table_[uStack_74] = (TableEntryPtr)piVar3;
        goto LAB_002e5fb0;
      }
      pcVar8 = "(reinterpret_cast<uintptr_t>(node) & 1) == 0";
      uVar5 = 0x2c;
      uVar6 = 0x1ac;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_60,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/map.h"
               ,uVar6,uVar5,pcVar8);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_60);
  }
  tree_it.position_ = TStack_70.position_;
  tree_it.node_ = TStack_70.node_;
  tree_it._12_4_ = 0;
  internal::UntypedMapBase::EraseFromTree(pos.super_UntypedMapIterator.m_,uStack_74,tree_it);
  piVar3 = extraout_RAX;
LAB_002e5fb0:
  (pos.super_UntypedMapIterator.m_)->num_elements_ =
       (pos.super_UntypedMapIterator.m_)->num_elements_ - 1;
  if ((uStack_74 == (pos.super_UntypedMapIterator.m_)->index_of_first_non_null_) &&
     (piVar3 = (iterator *)(ulong)(pos.super_UntypedMapIterator.m_)->num_buckets_,
     uStack_74 < (pos.super_UntypedMapIterator.m_)->num_buckets_)) {
    piVar4 = (iterator *)(ulong)uStack_74;
    do {
      if ((pos.super_UntypedMapIterator.m_)->table_[(long)piVar4] != 0) {
        return piVar3;
      }
      piVar4 = (iterator *)((long)&(piVar4->super_UntypedMapIterator).node_ + 1);
      (pos.super_UntypedMapIterator.m_)->index_of_first_non_null_ = (map_index_t)piVar4;
    } while (piVar3 != piVar4);
  }
  return piVar3;
}

Assistant:

iterator erase(iterator pos) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto next = std::next(pos);
    ABSL_DCHECK_EQ(pos.m_, static_cast<Base*>(this));
    auto* node = static_cast<Node*>(pos.node_);
    this->erase_no_destroy(pos.bucket_index_, node);
    DestroyNode(node);
    return next;
  }